

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase284::run(TestCase284 *this)

{
  char *params_2;
  siginfo_t *params_3;
  siginfo_t *this_00;
  anon_enum_32 local_29c;
  DebugComparison<int,_int_&> _kjCondition;
  pthread_t mainThread;
  char *local_268;
  Maybe<kj::TimerImpl::SleepHooks_&> MStack_260;
  SignalPromiseAdapter *local_258;
  Own<kj::Function<void_()>::Iface,_std::nullptr_t> local_250;
  WaitScope waitScope;
  Thread thread;
  EventLoop loop;
  siginfo_t info;
  UnixEventPort port;
  
  if ((anonymous_namespace)::BROKEN_QEMU == '\0') {
    captureSignals();
    UnixEventPort::UnixEventPort(&port);
    EventLoop::EventLoop(&loop,&port.super_EventPort);
    waitScope.busyPollInterval = 0xffffffff;
    waitScope.fiber.ptr = (FiberBase *)0x0;
    waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
    waitScope.loop = &loop;
    EventLoop::enterScope(&loop);
    mainThread = pthread_self();
    local_250.ptr = (Iface *)operator_new(0x10);
    (local_250.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___005804e8;
    local_250.ptr[1]._vptr_Iface = (_func_int **)&mainThread;
    local_250.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::TestCase284::run()::$_0>>
          ::instance;
    Thread::Thread(&thread,(Function<void_()> *)&local_250);
    Own<kj::Function<void_()>::Iface,_std::nullptr_t>::dispose(&local_250);
    UnixEventPort::onSignal((UnixEventPort *)&_kjCondition,(int)&port);
    local_268 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
    ;
    MStack_260.ptr = (SleepHooks *)0x3d740e;
    local_258 = (SignalPromiseAdapter *)0x1400000131;
    params_2 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
    ;
    params_3 = (siginfo_t *)0x3d740e;
    this_00 = &info;
    Promise<siginfo_t>::wait((Promise<siginfo_t> *)this_00,&_kjCondition);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
    _kjCondition.result = info.si_signo == 0x17;
    _kjCondition.left = 0x17;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    if (kj::_::Debug::minSeverity < 3 && !_kjCondition.result) {
      params_2 = (char *)&local_29c;
      local_29c = _SC_AIO_LISTIO_MAX;
      _kjCondition.right = &this_00->si_signo;
      kj::_::Debug::log<char_const(&)[41],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x132,ERROR,
                 "\"failed: expected \" \"(23) == (info.si_signo)\", _kjCondition, 23, info.si_signo"
                 ,(char (*) [41])"failed: expected (23) == (info.si_signo)",&_kjCondition,
                 (int *)params_2,&this_00->si_signo);
      params_3 = this_00;
    }
    _kjCondition.right = &info.si_code;
    _kjCondition.result = info.si_code == -6;
    _kjCondition.left = -6;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
      local_29c = SI_TKILL;
      kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<__11,int&>&,__11,int&>
                ((char *)0x134,0x3e604d,0x3e60a6,(char *)&_kjCondition,(char (*) [46])&local_29c,
                 (DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
                  *)_kjCondition.right,(anon_enum_32 *)params_2,&params_3->si_signo);
    }
    Thread::~Thread(&thread);
    WaitScope::~WaitScope(&waitScope);
    EventLoop::~EventLoop(&loop);
    UnixEventPort::~UnixEventPort(&port);
  }
  return;
}

Assistant:

TEST(AsyncUnixTest, SignalsAsync) {
  if (BROKEN_QEMU) return;

  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  // Arrange for a signal to be sent from another thread.
  pthread_t mainThread KJ_UNUSED = pthread_self();
  Thread thread([&]() {
    delay();
#if __APPLE__ && KJ_USE_KQUEUE
    // MacOS kqueue only receives process-level signals and there's nothing much we can do about
    // that.
    kill(getpid(), SIGURG);
#else
    pthread_kill(mainThread, SIGURG);
#endif
  });

  siginfo_t info = port.onSignal(SIGURG).wait(waitScope);
  EXPECT_EQ(SIGURG, info.si_signo);
#if __linux__
  EXPECT_SI_CODE(SI_TKILL, info.si_code);
#endif
}